

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_opendir(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  char *__name;
  DIR *dp_00;
  DIR *dp;
  char *pathstr;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen path_local;
  
  __name = mkstr(path);
  dp_00 = opendir(__name);
  free(__name);
  if (dp_00 == (DIR *)0x0) {
    uss_error((UnixSftpServer *)(srv + -6),reply);
  }
  else {
    uss_return_new_dirhandle((UnixSftpServer *)(srv + -6),reply,(DIR *)dp_00);
  }
  return;
}

Assistant:

static void uss_opendir(SftpServer *srv, SftpReplyBuilder *reply,
                        ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *pathstr = mkstr(path);
    DIR *dp = opendir(pathstr);
    free(pathstr);

    if (!dp) {
        uss_error(uss, reply);
    } else {
        uss_return_new_dirhandle(uss, reply, dp);
    }
}